

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbar_mugshot.cpp
# Opt level: O0

FTexture * __thiscall
FMugShot::GetFace(FMugShot *this,player_t *player,char *default_face,int accuracy,
                 StateFlags stateflags)

{
  int direction;
  int iVar1;
  char *local_68;
  char *local_60;
  char *skin_face;
  int skin;
  int max;
  int level;
  int angle;
  StateFlags stateflags_local;
  int accuracy_local;
  char *default_face_local;
  player_t *player_local;
  FMugShot *this_local;
  
  direction = UpdateState(this,player,stateflags);
  skin = 0;
  skin_face._4_4_ = player->mo->MugShotMaxHealth;
  if (skin_face._4_4_ < 0) {
    skin_face._4_4_ = APlayerPawn::GetMaxHealth(player->mo);
  }
  else if (skin_face._4_4_ == 0) {
    skin_face._4_4_ = 100;
  }
  for (; player->health < ((accuracy + -1) - skin) * (skin_face._4_4_ / accuracy); skin = skin + 1)
  {
  }
  if (this->CurrentState == (FMugShotState *)0x0) {
    this_local = (FMugShot *)0x0;
  }
  else {
    iVar1 = userinfo_t::GetSkin(&player->userinfo);
    if ((stateflags & CUSTOM) == STANDARD) {
      if (player->morphTics == 0) {
        local_68 = skins[iVar1].face;
      }
      else {
        local_68 = FString::GetChars(&player->MorphedPlayerClass->Face);
      }
      local_60 = local_68;
    }
    else {
      local_60 = (char *)0x0;
    }
    this_local = (FMugShot *)
                 FMugShotState::GetCurrentFrameTexture
                           (this->CurrentState,default_face,local_60,skin,direction);
  }
  return (FTexture *)this_local;
}

Assistant:

FTexture *FMugShot::GetFace(player_t *player, const char *default_face, int accuracy, StateFlags stateflags)
{
	int angle = UpdateState(player, stateflags);
	int level = 0;
	int max = player->mo->MugShotMaxHealth;
	if (max < 0)
	{
		max = player->mo->GetMaxHealth();
	}
	else if (max == 0)
	{
		max = 100;
	}
	while (player->health < (accuracy - 1 - level) * (max / accuracy))
	{
		level++;
	}
	if (CurrentState != NULL)
	{
		int skin = player->userinfo.GetSkin();
		const char *skin_face = (stateflags & FMugShot::CUSTOM) ? nullptr : (player->morphTics ? player->MorphedPlayerClass->Face.GetChars() : skins[skin].face);
		return CurrentState->GetCurrentFrameTexture(default_face, skin_face, level, angle);
	}
	return NULL;
}